

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStreamPrivate::QTextStreamPrivate(QTextStreamPrivate *this,QTextStream *q_ptr)

{
  void *pvVar1;
  
  this->readConverterSavedStateOffset = 0;
  (this->params).padChar.ucs = L'\0';
  (this->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
  super_QFlagsStorage<QTextStream::NumberFlag>.i = 0;
  pvVar1 = (void *)0x0;
  memset(&this->stringOpenMode,0,0xe0);
  QLocale::c(&this->locale,pvVar1);
  this->hasWrittenData = false;
  this->generateBOM = false;
  this->q_ptr = q_ptr;
  reset(this);
  return;
}

Assistant:

QTextStreamPrivate::QTextStreamPrivate(QTextStream *q_ptr)
    : readConverterSavedStateOffset(0),
      locale(QLocale::c())
{
    this->q_ptr = q_ptr;
    reset();
}